

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

bool __thiscall spirv_cross::SPIRConstant::constant_is_null(SPIRConstant *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint local_20;
  uint local_1c;
  uint32_t row;
  uint32_t col;
  SPIRConstant *this_local;
  
  if ((this->specialization & 1U) == 0) {
    bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::empty
                      (&(this->subconstants).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>);
    if (bVar1) {
      for (local_1c = 0; uVar2 = columns(this), local_1c < uVar2; local_1c = local_1c + 1) {
        for (local_20 = 0; uVar2 = vector_size(this), local_20 < uVar2; local_20 = local_20 + 1) {
          uVar3 = scalar_u64(this,local_1c,local_20);
          if (uVar3 != 0) {
            return false;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool constant_is_null() const
	{
		if (specialization)
			return false;
		if (!subconstants.empty())
			return false;

		for (uint32_t col = 0; col < columns(); col++)
			for (uint32_t row = 0; row < vector_size(); row++)
				if (scalar_u64(col, row) != 0)
					return false;

		return true;
	}